

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O3

void __thiscall
ByteData_DefaultConstructor_Test::~ByteData_DefaultConstructor_Test
          (ByteData_DefaultConstructor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ByteData, DefaultConstructor) {
  ByteData byte_data;
  size_t size = 0;

  EXPECT_STREQ(byte_data.GetHex().c_str(), "");
  EXPECT_EQ(byte_data.GetDataSize(), size);
  EXPECT_TRUE(byte_data.IsEmpty());
  EXPECT_STREQ(
    byte_data.Serialize().GetHex().c_str(),
    "00");
  EXPECT_TRUE(byte_data.Empty());   // TODO(k-matsuzawa): deprecated API

  EXPECT_EQ(0, byte_data.GetHeadData());
  EXPECT_EQ(0, byte_data.Serialize().GetHeadData());
}